

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.h
# Opt level: O2

void set_header_add(FIOBJ hash,FIOBJ name,FIOBJ value)

{
  FIOBJ FVar1;
  size_t sVar2;
  FIOBJ ary;
  size_t i;
  ulong pos;
  
  FVar1 = fiobj_hash_replace(hash,name,value);
  if (FVar1 == 0) {
    return;
  }
  if (value != 0) {
    sVar2 = fiobj_type_is(FVar1,FIOBJ_T_ARRAY);
    ary = FVar1;
    if (sVar2 == 0) {
      ary = fiobj_ary_new();
      fiobj_ary_push(ary,FVar1);
    }
    sVar2 = fiobj_type_is(value,FIOBJ_T_ARRAY);
    if (sVar2 != 0) {
      pos = 0;
      while( true ) {
        sVar2 = fiobj_ary_count(value);
        if (sVar2 <= pos) break;
        FVar1 = fiobj_ary_index(value,pos);
        fiobj_dup(FVar1);
        fiobj_ary_push(ary,FVar1);
        pos = pos + 1;
      }
      fiobj_hash_set(hash,name,ary);
      return;
    }
    fiobj_ary_push(ary,value);
    fiobj_hash_replace(hash,name,ary);
    return;
  }
  fiobj_free(FVar1);
  return;
}

Assistant:

static inline void set_header_add(FIOBJ hash, FIOBJ name, FIOBJ value) {
  FIOBJ old = fiobj_hash_replace(hash, name, value);
  if (!old)
    return;
  if (!value) {
    fiobj_free(old);
    return;
  }
  if (!FIOBJ_TYPE_IS(old, FIOBJ_T_ARRAY)) {
    FIOBJ tmp = fiobj_ary_new();
    fiobj_ary_push(tmp, old);
    old = tmp;
  }
  if (FIOBJ_TYPE_IS(value, FIOBJ_T_ARRAY)) {
    for (size_t i = 0; i < fiobj_ary_count(value); ++i) {
      fiobj_ary_push(old, fiobj_dup(fiobj_ary_index(value, i)));
    }
    /* frees `value` */
    fiobj_hash_set(hash, name, old);
    return;
  }
  /* value will be owned by both hash and array */
  fiobj_ary_push(old, value);
  /* don't free `value` (leave in array) */
  fiobj_hash_replace(hash, name, old);
}